

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O1

size_t ZSTD_decompressStream(ZSTD_DStream *zds,ZSTD_outBuffer *output,ZSTD_inBuffer *input)

{
  BYTE *src;
  uint uVar1;
  ZSTD_dStage ZVar2;
  ulong uVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  ZSTD_dStreamStage ZVar7;
  char *pcVar8;
  size_t sVar9;
  ulong uVar10;
  void *src_00;
  void *pvVar11;
  void *pvVar12;
  void *dst;
  size_t sVar13;
  void *pvVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  size_t local_a8;
  void *local_90;
  
  uVar10 = input->pos;
  uVar3 = input->size;
  if (uVar3 < uVar10) {
    local_a8 = 0xffffffffffffffb8;
  }
  else {
    local_a8 = 0xffffffffffffffba;
    if (output->pos <= output->size) {
      src_00 = (void *)(uVar10 + (long)input->src);
      pvVar14 = (void *)(uVar3 + (long)input->src);
      pvVar11 = (void *)(output->pos + (long)output->dst);
      pvVar12 = (void *)(output->size + (long)output->dst);
      src = zds->headerBuffer;
      dst = pvVar11;
      local_90 = src_00;
LAB_004942f4:
      bVar5 = true;
      bVar4 = bVar5;
      switch(zds->streamStage) {
      case zdss_init:
        goto switchD_00494318_caseD_0;
      case zdss_loadHeader:
        goto switchD_00494318_caseD_1;
      case zdss_read:
        goto switchD_00494318_caseD_2;
      case zdss_load:
        goto LAB_00494841;
      case zdss_flush:
        goto switchD_00494318_caseD_4;
      default:
        return 0xffffffffffffffff;
      }
    }
  }
  return local_a8;
switchD_00494318_caseD_0:
  zds->streamStage = zdss_loadHeader;
  zds->inPos = 0;
  zds->legacyVersion = 0;
  zds->hostageByte = 0;
  zds->lhSize = 0;
  zds->outStart = 0;
  zds->outEnd = 0;
switchD_00494318_caseD_1:
  sVar13 = ZSTD_getFrameHeader_advanced(&zds->fParams,src,zds->lhSize,zds->format);
  if (sVar13 < 0xffffffffffffff89) {
    if (sVar13 == 0) {
      iVar6 = 0;
    }
    else {
      sVar9 = zds->lhSize;
      uVar15 = sVar13 - sVar9;
      uVar16 = (long)pvVar14 - (long)local_90;
      if (uVar16 < uVar15) {
        if (pvVar14 != local_90) {
          memcpy(src + sVar9,local_90,uVar16);
          zds->lhSize = zds->lhSize + uVar16;
        }
        input->pos = input->size;
        if (sVar13 < 7) {
          sVar13 = 6;
        }
        iVar6 = 1;
        local_a8 = (sVar13 - zds->lhSize) + 3;
      }
      else {
        memcpy(src + sVar9,local_90,uVar15);
        zds->lhSize = sVar13;
        local_90 = (void *)((long)local_90 + uVar15);
        iVar6 = 4;
      }
    }
  }
  else {
    iVar6 = 1;
    local_a8 = sVar13;
  }
  bVar4 = true;
  bVar5 = true;
  if (iVar6 != 4) {
    if (iVar6 != 0) {
      return local_a8;
    }
    uVar15 = (zds->fParams).frameContentSize;
    if (((uVar15 != 0) && ((zds->fParams).windowSize != 0)) &&
       (uVar15 <= (ulong)((long)pvVar12 - (long)dst))) {
      sVar13 = ZSTD_findFrameCompressedSize(src_00,uVar3 - uVar10);
      if (uVar3 - uVar10 < sVar13) {
        bVar4 = true;
        iVar6 = 0;
      }
      else {
        sVar9 = ZSTD_decompressMultiFrame
                          (zds,dst,(long)pvVar12 - (long)dst,src_00,sVar13,(void *)0x0,0,zds->ddict)
        ;
        bVar4 = 0xffffffffffffff88 < sVar9;
        if (bVar4) {
          iVar6 = 1;
          local_a8 = sVar9;
        }
        else {
          local_90 = (void *)(sVar13 + (long)src_00);
          dst = (void *)((long)dst + sVar9);
          zds->expected = 0;
          zds->streamStage = zdss_init;
          iVar6 = 4;
        }
      }
      if (iVar6 == 4) goto LAB_00494a5b;
      bVar5 = bVar4;
      if (iVar6 != 0) {
        return local_a8;
      }
    }
    ZSTD_decompressBegin_usingDDict(zds,zds->ddict);
    if ((*(uint *)zds->headerBuffer & 0xfffffff0) == 0x184d2a50) {
      zds->expected = (ulong)*(uint *)(zds->headerBuffer + 4);
      zds->stage = ZSTDds_skipFrame;
    }
    else {
      sVar13 = ZSTD_decodeFrameHeader(zds,src,zds->lhSize);
      if (0xffffffffffffff88 < sVar13) {
        return sVar13;
      }
      zds->expected = 3;
      zds->stage = ZSTDds_decodeBlockHeader;
    }
    uVar15 = (zds->fParams).windowSize;
    if (uVar15 < 0x401) {
      uVar15 = 0x400;
    }
    (zds->fParams).windowSize = uVar15;
    if (zds->maxWindowSize < uVar15) {
      return 0xfffffffffffffff0;
    }
    uVar1 = (zds->fParams).blockSizeMax;
    if (uVar1 < 5) {
      uVar1 = 4;
    }
    uVar17 = (ulong)uVar1;
    uVar16 = (zds->fParams).frameContentSize;
    uVar18 = 0x20000;
    if (uVar15 < 0x20000) {
      uVar18 = uVar15;
    }
    uVar15 = uVar15 + uVar18 + 0x10;
    if (uVar15 < uVar16) {
      uVar16 = uVar15;
    }
    if ((zds->inBuffSize < uVar17) || (bVar4 = true, zds->outBuffSize < uVar16)) {
      if (zds->staticSize == 0) {
        ZSTD_free(zds->inBuff,zds->customMem);
        bVar4 = false;
        zds->inBuffSize = 0;
        zds->outBuffSize = 0;
        pcVar8 = (char *)ZSTD_malloc(uVar16 + uVar17,zds->customMem);
        zds->inBuff = pcVar8;
        if (pcVar8 != (char *)0x0) goto LAB_004946f2;
        local_a8 = 0xffffffffffffffc0;
      }
      else if (zds->staticSize - 0x271f8 < uVar16 + uVar17) {
        local_a8 = 0xffffffffffffffc0;
        bVar4 = false;
      }
      else {
LAB_004946f2:
        zds->inBuffSize = uVar17;
        zds->outBuff = zds->inBuff + uVar17;
        zds->outBuffSize = uVar16;
        bVar4 = true;
      }
    }
    if (!bVar4) {
      return local_a8;
    }
    zds->streamStage = zdss_read;
switchD_00494318_caseD_2:
    uVar15 = zds->expected;
    if (uVar15 == 0) {
      ZVar7 = zdss_init;
      bVar5 = false;
LAB_00494785:
      zds->streamStage = ZVar7;
      iVar6 = 4;
      sVar13 = local_a8;
      bVar4 = bVar5;
    }
    else {
      iVar6 = 0;
      sVar13 = local_a8;
      bVar4 = bVar5;
      if (uVar15 <= (ulong)((long)pvVar14 - (long)local_90)) {
        ZVar2 = zds->stage;
        if (ZVar2 == ZSTDds_skipFrame) {
          sVar13 = 0;
        }
        else {
          sVar13 = zds->outBuffSize - zds->outStart;
        }
        sVar9 = ZSTD_decompressContinue(zds,zds->outBuff + zds->outStart,sVar13,local_90,uVar15);
        iVar6 = 1;
        sVar13 = sVar9;
        if ((sVar9 < 0xffffffffffffff89) &&
           ((local_90 = (void *)((long)local_90 + uVar15), ZVar2 == ZSTDds_skipFrame ||
            (iVar6 = 4, sVar13 = local_a8, sVar9 != 0)))) {
          zds->outEnd = zds->outStart + sVar9;
          ZVar7 = zdss_flush;
          goto LAB_00494785;
        }
      }
    }
    local_a8 = sVar13;
    if (iVar6 != 4) {
      if (iVar6 != 0) {
        return local_a8;
      }
      if (local_90 == pvVar14) {
        bVar4 = false;
      }
      else {
        zds->streamStage = zdss_load;
LAB_00494841:
        sVar13 = zds->expected;
        sVar9 = zds->inPos;
        uVar16 = sVar13 - sVar9;
        ZVar2 = zds->stage;
        uVar15 = uVar16;
        if (ZVar2 == ZSTDds_skipFrame) {
          if ((ulong)((long)pvVar14 - (long)local_90) <= uVar16) {
            uVar15 = (long)pvVar14 - (long)local_90;
          }
LAB_004948d7:
          zds->inPos = zds->inPos + uVar15;
          local_90 = (void *)((long)local_90 + uVar15);
          iVar6 = 4;
          if (uVar15 < uVar16) {
            bVar4 = false;
          }
          else {
            sVar13 = ZSTD_decompressContinue
                               (zds,zds->outBuff + zds->outStart,zds->outBuffSize - zds->outStart,
                                zds->inBuff,sVar13);
            if (sVar13 < 0xffffffffffffff89) {
              zds->inPos = 0;
              if ((ZVar2 == ZSTDds_skipFrame) || (sVar13 != 0)) {
                zds->outEnd = zds->outStart + sVar13;
                iVar6 = 0;
              }
              else {
                zds->streamStage = zdss_read;
              }
            }
            else {
              iVar6 = 1;
              local_a8 = sVar13;
            }
          }
        }
        else {
          if (uVar16 <= zds->inBuffSize - sVar9) {
            if ((ulong)((long)pvVar14 - (long)local_90) <= uVar16) {
              uVar15 = (long)pvVar14 - (long)local_90;
            }
            memcpy(zds->inBuff + sVar9,local_90,uVar15);
            goto LAB_004948d7;
          }
          local_a8 = 0xffffffffffffffec;
          iVar6 = 1;
        }
        if (iVar6 != 4) {
          if (iVar6 != 0) {
            return local_a8;
          }
          zds->streamStage = zdss_flush;
switchD_00494318_caseD_4:
          uVar16 = zds->outEnd - zds->outStart;
          uVar18 = (long)pvVar12 - (long)dst;
          uVar15 = uVar18;
          if (uVar16 <= uVar18) {
            uVar15 = uVar16;
          }
          memcpy(dst,zds->outBuff + zds->outStart,uVar15);
          dst = (void *)((long)dst + uVar15);
          sVar13 = uVar15 + zds->outStart;
          zds->outStart = sVar13;
          if (uVar18 < uVar16) {
            bVar4 = false;
          }
          else {
            zds->streamStage = zdss_read;
            if ((zds->outBuffSize < (zds->fParams).frameContentSize) &&
               (zds->outBuffSize < sVar13 + (zds->fParams).blockSizeMax)) {
              zds->outStart = 0;
              zds->outEnd = 0;
            }
          }
        }
      }
    }
  }
LAB_00494a5b:
  if (!bVar4) {
    uVar10 = (long)local_90 - (long)input->src;
    input->pos = uVar10;
    output->pos = (long)dst - (long)output->dst;
    if ((local_90 == src_00) && (dst == pvVar11)) {
      iVar6 = zds->noForwardProgress;
      zds->noForwardProgress = iVar6 + 1;
      if (0xe < iVar6) {
        if (dst == pvVar12) {
          return 0xffffffffffffffba;
        }
        if (local_90 == pvVar14) {
          return 0xffffffffffffffb8;
        }
      }
    }
    else {
      zds->noForwardProgress = 0;
    }
    if (zds->expected != 0) {
      return (zds->expected - zds->inPos) + (ulong)(zds->stage == ZSTDds_decompressBlock) * 3;
    }
    if (zds->outEnd == zds->outStart) {
      if (zds->hostageByte != 0) {
        if (input->size <= uVar10) {
          zds->streamStage = zdss_read;
          return 1;
        }
        input->pos = uVar10 + 1;
      }
      return 0;
    }
    if (zds->hostageByte != 0) {
      return 1;
    }
    input->pos = uVar10 - 1;
    zds->hostageByte = 1;
    return 1;
  }
  goto LAB_004942f4;
}

Assistant:

size_t ZSTD_decompressStream(ZSTD_DStream* zds, ZSTD_outBuffer* output, ZSTD_inBuffer* input)
{
    const char* const istart = (const char*)(input->src) + input->pos;
    const char* const iend = (const char*)(input->src) + input->size;
    const char* ip = istart;
    char* const ostart = (char*)(output->dst) + output->pos;
    char* const oend = (char*)(output->dst) + output->size;
    char* op = ostart;
    U32 someMoreWork = 1;

    DEBUGLOG(5, "ZSTD_decompressStream");
    if (input->pos > input->size) {  /* forbidden */
        DEBUGLOG(5, "in: pos: %u   vs size: %u",
                    (U32)input->pos, (U32)input->size);
        return ERROR(srcSize_wrong);
    }
    if (output->pos > output->size) {  /* forbidden */
        DEBUGLOG(5, "out: pos: %u   vs size: %u",
                    (U32)output->pos, (U32)output->size);
        return ERROR(dstSize_tooSmall);
    }
    DEBUGLOG(5, "input size : %u", (U32)(input->size - input->pos));

    while (someMoreWork) {
        switch(zds->streamStage)
        {
        case zdss_init :
            DEBUGLOG(5, "stage zdss_init => transparent reset ");
            ZSTD_resetDStream(zds);   /* transparent reset on starting decoding a new frame */
            /* fall-through */

        case zdss_loadHeader :
            DEBUGLOG(5, "stage zdss_loadHeader (srcSize : %u)", (U32)(iend - ip));
#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT>=1)
            if (zds->legacyVersion) {
                /* legacy support is incompatible with static dctx */
                if (zds->staticSize) return ERROR(memory_allocation);
                {   size_t const hint = ZSTD_decompressLegacyStream(zds->legacyContext, zds->legacyVersion, output, input);
                    if (hint==0) zds->streamStage = zdss_init;
                    return hint;
            }   }
#endif
            {   size_t const hSize = ZSTD_getFrameHeader_advanced(&zds->fParams, zds->headerBuffer, zds->lhSize, zds->format);
                DEBUGLOG(5, "header size : %u", (U32)hSize);
                if (ZSTD_isError(hSize)) {
#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT>=1)
                    U32 const legacyVersion = ZSTD_isLegacy(istart, iend-istart);
                    if (legacyVersion) {
                        const void* const dict = zds->ddict ? ZSTD_DDict_dictContent(zds->ddict) : NULL;
                        size_t const dictSize = zds->ddict ? ZSTD_DDict_dictSize(zds->ddict) : 0;
                        DEBUGLOG(5, "ZSTD_decompressStream: detected legacy version v0.%u", legacyVersion);
                        /* legacy support is incompatible with static dctx */
                        if (zds->staticSize) return ERROR(memory_allocation);
                        CHECK_F(ZSTD_initLegacyStream(&zds->legacyContext,
                                    zds->previousLegacyVersion, legacyVersion,
                                    dict, dictSize));
                        zds->legacyVersion = zds->previousLegacyVersion = legacyVersion;
                        {   size_t const hint = ZSTD_decompressLegacyStream(zds->legacyContext, legacyVersion, output, input);
                            if (hint==0) zds->streamStage = zdss_init;   /* or stay in stage zdss_loadHeader */
                            return hint;
                    }   }
#endif
                    return hSize;   /* error */
                }
                if (hSize != 0) {   /* need more input */
                    size_t const toLoad = hSize - zds->lhSize;   /* if hSize!=0, hSize > zds->lhSize */
                    size_t const remainingInput = (size_t)(iend-ip);
                    assert(iend >= ip);
                    if (toLoad > remainingInput) {   /* not enough input to load full header */
                        if (remainingInput > 0) {
                            memcpy(zds->headerBuffer + zds->lhSize, ip, remainingInput);
                            zds->lhSize += remainingInput;
                        }
                        input->pos = input->size;
                        return (MAX(ZSTD_FRAMEHEADERSIZE_MIN, hSize) - zds->lhSize) + ZSTD_blockHeaderSize;   /* remaining header bytes + next block header */
                    }
                    assert(ip != NULL);
                    memcpy(zds->headerBuffer + zds->lhSize, ip, toLoad); zds->lhSize = hSize; ip += toLoad;
                    break;
            }   }

            /* check for single-pass mode opportunity */
            if (zds->fParams.frameContentSize && zds->fParams.windowSize /* skippable frame if == 0 */
                && (U64)(size_t)(oend-op) >= zds->fParams.frameContentSize) {
                size_t const cSize = ZSTD_findFrameCompressedSize(istart, iend-istart);
                if (cSize <= (size_t)(iend-istart)) {
                    /* shortcut : using single-pass mode */
                    size_t const decompressedSize = ZSTD_decompress_usingDDict(zds, op, oend-op, istart, cSize, zds->ddict);
                    if (ZSTD_isError(decompressedSize)) return decompressedSize;
                    DEBUGLOG(4, "shortcut to single-pass ZSTD_decompress_usingDDict()")
                    ip = istart + cSize;
                    op += decompressedSize;
                    zds->expected = 0;
                    zds->streamStage = zdss_init;
                    someMoreWork = 0;
                    break;
            }   }

            /* Consume header (see ZSTDds_decodeFrameHeader) */
            DEBUGLOG(4, "Consume header");
            CHECK_F(ZSTD_decompressBegin_usingDDict(zds, zds->ddict));

            if ((MEM_readLE32(zds->headerBuffer) & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START) {  /* skippable frame */
                zds->expected = MEM_readLE32(zds->headerBuffer + ZSTD_FRAMEIDSIZE);
                zds->stage = ZSTDds_skipFrame;
            } else {
                CHECK_F(ZSTD_decodeFrameHeader(zds, zds->headerBuffer, zds->lhSize));
                zds->expected = ZSTD_blockHeaderSize;
                zds->stage = ZSTDds_decodeBlockHeader;
            }

            /* control buffer memory usage */
            DEBUGLOG(4, "Control max memory usage (%u KB <= max %u KB)",
                        (U32)(zds->fParams.windowSize >>10),
                        (U32)(zds->maxWindowSize >> 10) );
            zds->fParams.windowSize = MAX(zds->fParams.windowSize, 1U << ZSTD_WINDOWLOG_ABSOLUTEMIN);
            if (zds->fParams.windowSize > zds->maxWindowSize) return ERROR(frameParameter_windowTooLarge);

            /* Adapt buffer sizes to frame header instructions */
            {   size_t const neededInBuffSize = MAX(zds->fParams.blockSizeMax, 4 /* frame checksum */);
                size_t const neededOutBuffSize = ZSTD_decodingBufferSize_min(zds->fParams.windowSize, zds->fParams.frameContentSize);
                if ((zds->inBuffSize < neededInBuffSize) || (zds->outBuffSize < neededOutBuffSize)) {
                    size_t const bufferSize = neededInBuffSize + neededOutBuffSize;
                    DEBUGLOG(4, "inBuff  : from %u to %u",
                                (U32)zds->inBuffSize, (U32)neededInBuffSize);
                    DEBUGLOG(4, "outBuff : from %u to %u",
                                (U32)zds->outBuffSize, (U32)neededOutBuffSize);
                    if (zds->staticSize) {  /* static DCtx */
                        DEBUGLOG(4, "staticSize : %u", (U32)zds->staticSize);
                        assert(zds->staticSize >= sizeof(ZSTD_DCtx));  /* controlled at init */
                        if (bufferSize > zds->staticSize - sizeof(ZSTD_DCtx))
                            return ERROR(memory_allocation);
                    } else {
                        ZSTD_free(zds->inBuff, zds->customMem);
                        zds->inBuffSize = 0;
                        zds->outBuffSize = 0;
                        zds->inBuff = (char*)ZSTD_malloc(bufferSize, zds->customMem);
                        if (zds->inBuff == NULL) return ERROR(memory_allocation);
                    }
                    zds->inBuffSize = neededInBuffSize;
                    zds->outBuff = zds->inBuff + zds->inBuffSize;
                    zds->outBuffSize = neededOutBuffSize;
            }   }
            zds->streamStage = zdss_read;
            /* fall-through */

        case zdss_read:
            DEBUGLOG(5, "stage zdss_read");
            {   size_t const neededInSize = ZSTD_nextSrcSizeToDecompress(zds);
                DEBUGLOG(5, "neededInSize = %u", (U32)neededInSize);
                if (neededInSize==0) {  /* end of frame */
                    zds->streamStage = zdss_init;
                    someMoreWork = 0;
                    break;
                }
                if ((size_t)(iend-ip) >= neededInSize) {  /* decode directly from src */
                    int const isSkipFrame = ZSTD_isSkipFrame(zds);
                    size_t const decodedSize = ZSTD_decompressContinue(zds,
                        zds->outBuff + zds->outStart, (isSkipFrame ? 0 : zds->outBuffSize - zds->outStart),
                        ip, neededInSize);
                    if (ZSTD_isError(decodedSize)) return decodedSize;
                    ip += neededInSize;
                    if (!decodedSize && !isSkipFrame) break;   /* this was just a header */
                    zds->outEnd = zds->outStart + decodedSize;
                    zds->streamStage = zdss_flush;
                    break;
            }   }
            if (ip==iend) { someMoreWork = 0; break; }   /* no more input */
            zds->streamStage = zdss_load;
            /* fall-through */

        case zdss_load:
            {   size_t const neededInSize = ZSTD_nextSrcSizeToDecompress(zds);
                size_t const toLoad = neededInSize - zds->inPos;
                int const isSkipFrame = ZSTD_isSkipFrame(zds);
                size_t loadedSize;
                if (isSkipFrame) {
                    loadedSize = MIN(toLoad, (size_t)(iend-ip));
                } else {
                    if (toLoad > zds->inBuffSize - zds->inPos) return ERROR(corruption_detected);   /* should never happen */
                    loadedSize = ZSTD_limitCopy(zds->inBuff + zds->inPos, toLoad, ip, iend-ip);
                }
                ip += loadedSize;
                zds->inPos += loadedSize;
                if (loadedSize < toLoad) { someMoreWork = 0; break; }   /* not enough input, wait for more */

                /* decode loaded input */
                {   size_t const decodedSize = ZSTD_decompressContinue(zds,
                        zds->outBuff + zds->outStart, zds->outBuffSize - zds->outStart,
                        zds->inBuff, neededInSize);
                    if (ZSTD_isError(decodedSize)) return decodedSize;
                    zds->inPos = 0;   /* input is consumed */
                    if (!decodedSize && !isSkipFrame) { zds->streamStage = zdss_read; break; }   /* this was just a header */
                    zds->outEnd = zds->outStart +  decodedSize;
            }   }
            zds->streamStage = zdss_flush;
            /* fall-through */

        case zdss_flush:
            {   size_t const toFlushSize = zds->outEnd - zds->outStart;
                size_t const flushedSize = ZSTD_limitCopy(op, oend-op, zds->outBuff + zds->outStart, toFlushSize);
                op += flushedSize;
                zds->outStart += flushedSize;
                if (flushedSize == toFlushSize) {  /* flush completed */
                    zds->streamStage = zdss_read;
                    if ( (zds->outBuffSize < zds->fParams.frameContentSize)
                      && (zds->outStart + zds->fParams.blockSizeMax > zds->outBuffSize) ) {
                        DEBUGLOG(5, "restart filling outBuff from beginning (left:%i, needed:%u)",
                                (int)(zds->outBuffSize - zds->outStart),
                                (U32)zds->fParams.blockSizeMax);
                        zds->outStart = zds->outEnd = 0;
                    }
                    break;
            }   }
            /* cannot complete flush */
            someMoreWork = 0;
            break;

        default:
            assert(0);    /* impossible */
            return ERROR(GENERIC);   /* some compiler require default to do something */
    }   }

    /* result */
    input->pos = (size_t)(ip - (const char*)(input->src));
    output->pos = (size_t)(op - (char*)(output->dst));
    if ((ip==istart) && (op==ostart)) {  /* no forward progress */
        zds->noForwardProgress ++;
        if (zds->noForwardProgress >= ZSTD_NO_FORWARD_PROGRESS_MAX) {
            if (op==oend) return ERROR(dstSize_tooSmall);
            if (ip==iend) return ERROR(srcSize_wrong);
            assert(0);
        }
    } else {
        zds->noForwardProgress = 0;
    }
    {   size_t nextSrcSizeHint = ZSTD_nextSrcSizeToDecompress(zds);
        if (!nextSrcSizeHint) {   /* frame fully decoded */
            if (zds->outEnd == zds->outStart) {  /* output fully flushed */
                if (zds->hostageByte) {
                    if (input->pos >= input->size) {
                        /* can't release hostage (not present) */
                        zds->streamStage = zdss_read;
                        return 1;
                    }
                    input->pos++;  /* release hostage */
                }   /* zds->hostageByte */
                return 0;
            }  /* zds->outEnd == zds->outStart */
            if (!zds->hostageByte) { /* output not fully flushed; keep last byte as hostage; will be released when all output is flushed */
                input->pos--;   /* note : pos > 0, otherwise, impossible to finish reading last block */
                zds->hostageByte=1;
            }
            return 1;
        }  /* nextSrcSizeHint==0 */
        nextSrcSizeHint += ZSTD_blockHeaderSize * (ZSTD_nextInputType(zds) == ZSTDnit_block);   /* preload header of next block */
        assert(zds->inPos <= nextSrcSizeHint);
        nextSrcSizeHint -= zds->inPos;   /* part already loaded*/
        return nextSrcSizeHint;
    }
}